

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O3

int get_url(void)

{
  CURLUcode CVar1;
  int iVar2;
  char *in_RAX;
  long lVar3;
  char *pcVar4;
  urltestcase *puVar5;
  char *url;
  char *local_38;
  
  pcVar4 = "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA://hostname/path";
  puVar5 = get_url_list;
  local_38 = in_RAX;
  while( true ) {
    puVar5 = puVar5 + 1;
    lVar3 = curl_url();
    if (lVar3 == 0) {
      return 1;
    }
    CVar1 = curl_url_set(lVar3,0,pcVar4,puVar5[-1].urlflags);
    if (CVar1 == CURLUE_OK) {
      local_38 = (char *)0x0;
      iVar2 = curl_url_get(lVar3,0,&local_38,puVar5[-1].getflags);
      if (iVar2 == 0) {
        iVar2 = checkurl(local_38,puVar5[-1].out);
      }
      else {
        curl_mfprintf(_stderr,"%s:%d returned %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                      ,0x330,iVar2);
        iVar2 = 1;
      }
      curl_free(local_38);
    }
    else {
      iVar2 = 0;
      if (CVar1 != puVar5[-1].ucode) {
        curl_mfprintf(_stderr,"Get URL\nin: %s\nreturned %d (expected %d)\n",pcVar4,CVar1);
        iVar2 = 1;
      }
    }
    curl_url_cleanup(lVar3);
    pcVar4 = puVar5->in;
    if (pcVar4 == (char *)0x0) break;
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

static int get_url(void)
{
  int i;
  int error = 0;
  for(i = 0; get_url_list[i].in && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL, get_url_list[i].in,
                      get_url_list[i].urlflags);
    if(!rc) {
      char *url = NULL;
      rc = curl_url_get(urlp, CURLUPART_URL, &url, get_url_list[i].getflags);

      if(rc) {
        fprintf(stderr, "%s:%d returned %d\n",
                __FILE__, __LINE__, (int)rc);
        error++;
      }
      else {
        if(checkurl(url, get_url_list[i].out)) {
          error++;
        }
      }
      curl_free(url);
    }
    else if(rc != get_url_list[i].ucode) {
      fprintf(stderr, "Get URL\nin: %s\nreturned %d (expected %d)\n",
              get_url_list[i].in, (int)rc, get_url_list[i].ucode);
      error++;
    }
    curl_url_cleanup(urlp);
  }
  return error;
}